

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vw_exception.cc
# Opt level: O3

void __thiscall VW::vw_exception::~vw_exception(vw_exception *this)

{
  ~vw_exception(this);
  operator_delete(this);
  return;
}

Assistant:

const char* vw_exception::what() const _NOEXCEPT { return message.c_str(); }